

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H19_binary_search.c
# Opt level: O2

int main(void)

{
  uint __line;
  int iVar1;
  int iVar2;
  char *__assertion;
  
  iVar1 = func((int *)&DAT_00102010,0,10,0x7b);
  iVar2 = func((int *)&DAT_00102010,0,10,4);
  if (iVar1 == 8) {
    if (iVar2 == -1) {
      return 0;
    }
    __assertion = "notfound == -1";
    __line = 0x20;
  }
  else {
    __assertion = "found == 8";
    __line = 0x1f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H19_binary_search.c"
                ,__line,"int main()");
}

Assistant:

int main() {
  const int n = 10;
  int arr[n] = {10, 34, 40, 52, 66, 89, 91, 103, 123};

  int found = func(arr, 0, n, 123);
  int notfound = func(arr, 0, n, 4);

  assert(found == 8);
  assert(notfound == -1);

  return 0;
}